

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O2

BIO_METHOD * BIO_meth_new(int type,char *name)

{
  BIO_METHOD *pBVar1;
  
  pBVar1 = (BIO_METHOD *)OPENSSL_zalloc(0x50);
  if (pBVar1 != (BIO_METHOD *)0x0) {
    pBVar1->type = type;
    pBVar1->name = name;
  }
  return pBVar1;
}

Assistant:

BIO_METHOD *BIO_meth_new(int type, const char *name) {
  BIO_METHOD *method =
      reinterpret_cast<BIO_METHOD *>(OPENSSL_zalloc(sizeof(BIO_METHOD)));
  if (method == NULL) {
    return NULL;
  }
  method->type = type;
  method->name = name;
  return method;
}